

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntt_test.cpp
# Opt level: O3

void __thiscall NTT_Benchmark1e4_Test::~NTT_Benchmark1e4_Test(NTT_Benchmark1e4_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(NTT, Benchmark1e4) {
    initNTT();
    int n = 1e4;
    vector<ll> p1(n), p2(n);
    rep(j, 0, p1.size()) p1[j] = rand() % P;
    rep(j, 0, p2.size()) p2[j] = rand() % P;
    vector<ll> res = multiplyPolynomialsNTT(p1, p2);
    p1.resize(10), p2.resize(10);
    vector<ll> want = multiplyNaiveNTT(p1, p2);
    want.resize(10), res.resize(10); // check the first few
    EXPECT_EQ(want, res);
}